

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O1

ostream * operator<<(ostream *os,flexfloat<(unsigned_char)__x04_,_(unsigned_char)__x05_> *obj)

{
  uint uVar1;
  long lVar2;
  int_fast16_t exp;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  _Base_bitset<1UL> _Var5;
  ostream *poVar6;
  bitset<4UL> local_30;
  uint_t uVar3;
  
  poVar6 = os + *(long *)(*(long *)os + -0x18);
  if (get_manipulator_id()::id == '\0') {
    operator<<();
  }
  if (get_manipulator_id()::id < *(uint *)(poVar6 + 0xc0)) {
    lVar2 = (long)(int)get_manipulator_id()::id * 0x10 + *(long *)(poVar6 + 200);
  }
  else {
    lVar2 = std::ios_base::_M_grow_words((int)poVar6,SUB41(get_manipulator_id()::id,0));
  }
  if (*(long *)(lVar2 + 8) == 0) {
    std::ostream::_M_insert<double>((obj->v).value);
  }
  else {
    exp = flexfloat_exp(&obj->v);
    if (exp < 1) {
      uVar3 = flexfloat_denorm_frac(&obj->v,exp);
      uVar1 = (uint)uVar3;
      _Var5._M_w = 0;
    }
    else {
      uVar3 = flexfloat_frac(&obj->v);
      uVar1 = (uint)uVar3;
      _Var5._M_w = (_WordT)((uint)exp & 0xf);
    }
    poVar6 = std::ostream::_M_insert<bool>(SUB81(os,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-",1);
    local_30.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)_Var5._M_w;
    pbVar4 = std::operator<<(os,&local_30);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar4,"-",1);
    local_30.super__Base_bitset<1UL>._M_w._0_4_ = uVar1 & 0x1f;
    local_30.super__Base_bitset<1UL>._M_w._4_4_ = 0;
    std::operator<<(os,(bitset<5UL> *)&local_30);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const flexfloat& obj)
    {
        if(os.iword(get_manipulator_id()) == 0)
        {
            #ifndef FLEXFLOAT_ON_QUAD
            os << fp_t(obj);
            #endif
        }
        else
        {
            int_fast16_t exp = flexfloat_exp(&(obj.v));
            uint_t frac;
            if (exp <= 0) {
                frac = flexfloat_denorm_frac(&(obj.v), exp);
                exp = 0;
            }
            else
                frac = flexfloat_frac(&(obj.v));

            os << flexfloat_sign(&(obj.v)) << "-";
            os << std::bitset<exp_bits>(exp) << "-";
            os << std::bitset<frac_bits>(frac);
        }
        return os;
    }